

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::DynamicObjectPropertyEnumerator::MoveAndGetNextWithCache
          (DynamicObjectPropertyEnumerator *this,PropertyId *propertyId,
          PropertyAttributes *attributes)

{
  code *pcVar1;
  PropertyString *ptr;
  uchar uVar2;
  bool bVar3;
  PropertyId PVar4;
  int iVar5;
  ScriptContext *this_00;
  ThreadContext *this_01;
  CachedData *pCVar6;
  undefined4 *puVar7;
  WriteBarrierPtr<Js::PropertyString> **ppWVar8;
  PropertyString **ppPVar9;
  int **ppiVar10;
  uchar **ppuVar11;
  JavascriptString *pJVar12;
  PropertyString *local_78;
  PropertyId local_54;
  PropertyString *pPStack_50;
  PropertyId tempPropertyId_1;
  PropertyString *propertyString_1;
  PropertyString *pPStack_40;
  PropertyId tempPropertyId;
  PropertyString *propertyString;
  PropertyString *pPStack_30;
  PropertyAttributes propertyAttributes;
  JavascriptString *propertyStringName;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  DynamicObjectPropertyEnumerator *this_local;
  
  propertyStringName = (JavascriptString *)attributes;
  attributes_local = (PropertyAttributes *)propertyId;
  propertyId_local = (PropertyId *)this;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
  this_01 = ScriptContext::GetThreadContext(this_00);
  bVar3 = ThreadContext::IsRuntimeInTTDMode(this_01);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                ,0xaa,
                                "(!this->scriptContext->GetThreadContext()->IsRuntimeInTTDMode())",
                                "We should always trap out to explicit enumeration in this case");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  iVar5 = this->enumeratedCount;
  pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::operator->
                     (&this->cachedData);
  if (pCVar6->cachedCount < iVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                ,0xad,"(enumeratedCount <= cachedData->cachedCount)",
                                "enumeratedCount <= cachedData->cachedCount");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  propertyString._7_1_ = '\0';
  iVar5 = this->enumeratedCount;
  pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::operator->
                     (&this->cachedData);
  if (iVar5 < pCVar6->cachedCount) {
    pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::operator->
                       (&this->cachedData);
    ppWVar8 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&pCVar6->strings);
    ppPVar9 = Memory::WriteBarrierPtr::operator_cast_to_PropertyString__
                        ((WriteBarrierPtr *)(*ppWVar8 + this->enumeratedCount));
    pPStack_40 = *ppPVar9;
    pPStack_30 = pPStack_40;
    PVar4 = PropertyString::GetPropertyId(pPStack_40);
    *(PropertyId *)attributes_local = PVar4;
    MoveAndGetNextNoCache
              (this,(PropertyId *)((long)&propertyString_1 + 4),
               (PropertyAttributes *)propertyStringName);
    if (propertyString_1._4_4_ != *(int *)attributes_local) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                  ,0xba,"(tempPropertyId == propertyId)",
                                  "tempPropertyId == propertyId");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    iVar5 = this->objectIndex;
    pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::operator->
                       (&this->cachedData);
    ppiVar10 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&pCVar6->indexes);
    if (iVar5 != (*ppiVar10)[this->enumeratedCount]) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                  ,0xbb,
                                  "(this->objectIndex == cachedData->indexes[enumeratedCount])",
                                  "this->objectIndex == cachedData->indexes[enumeratedCount]");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::operator->
                       (&this->cachedData);
    ppiVar10 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&pCVar6->indexes);
    this->objectIndex = (*ppiVar10)[this->enumeratedCount];
    pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::operator->
                       (&this->cachedData);
    ppuVar11 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                         ((WriteBarrierPtr *)&pCVar6->attributes);
    propertyString._7_1_ = (*ppuVar11)[this->enumeratedCount];
    this->enumeratedCount = this->enumeratedCount + 1;
  }
  else {
    pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::operator->
                       (&this->cachedData);
    if ((pCVar6->completed & 1U) == 0) {
      pPStack_30 = (PropertyString *)
                   MoveAndGetNextNoCache
                             (this,(PropertyId *)attributes_local,
                              (PropertyAttributes *)((long)&propertyString + 7));
      if (pPStack_30 == (PropertyString *)0x0) {
        pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::
                 operator->(&this->cachedData);
        pCVar6->completed = true;
      }
      else {
        this_local = (DynamicObjectPropertyEnumerator *)pPStack_30;
        bVar3 = VarIs<Js::PropertyString,Js::JavascriptString>((JavascriptString *)pPStack_30);
        if (bVar3) {
          local_78 = UnsafeVarTo<Js::PropertyString,Js::JavascriptString>
                               ((JavascriptString *)this_local);
        }
        else {
          local_78 = (PropertyString *)0x0;
        }
        pPStack_50 = local_78;
        if (local_78 != (PropertyString *)0x0) {
          if (this->initialPropertyCount <= this->enumeratedCount) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                        ,0xcc,"(enumeratedCount < this->initialPropertyCount)",
                                        "enumeratedCount < this->initialPropertyCount");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          ptr = pPStack_50;
          pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::
                   operator->(&this->cachedData);
          ppWVar8 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                              ((WriteBarrierPtr *)&pCVar6->strings);
          Memory::WriteBarrierPtr<Js::PropertyString>::operator=
                    (*ppWVar8 + this->enumeratedCount,ptr);
          iVar5 = this->objectIndex;
          pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::
                   operator->(&this->cachedData);
          ppiVar10 = Memory::WriteBarrierPtr::operator_cast_to_int__
                               ((WriteBarrierPtr *)&pCVar6->indexes);
          uVar2 = propertyString._7_1_;
          (*ppiVar10)[this->enumeratedCount] = iVar5;
          pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::
                   operator->(&this->cachedData);
          ppuVar11 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                               ((WriteBarrierPtr *)&pCVar6->attributes);
          (*ppuVar11)[this->enumeratedCount] = uVar2;
          iVar5 = this->enumeratedCount + 1;
          this->enumeratedCount = iVar5;
          pCVar6 = Memory::WriteBarrierPtr<Js::DynamicObjectPropertyEnumerator::CachedData>::
                   operator->(&this->cachedData);
          pCVar6->cachedCount = iVar5;
        }
      }
    }
    else {
      pJVar12 = MoveAndGetNextNoCache(this,&local_54,(PropertyAttributes *)propertyStringName);
      if (pJVar12 != (JavascriptString *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                    ,0xdc,
                                    "(this->MoveAndGetNextNoCache(tempPropertyId, attributes) == nullptr)"
                                    ,
                                    "this->MoveAndGetNextNoCache(tempPropertyId, attributes) == nullptr"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pPStack_30 = (PropertyString *)0x0;
    }
  }
  if (propertyStringName != (JavascriptString *)0x0) {
    *(uchar *)&(propertyStringName->super_RecyclableObject).super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = propertyString._7_1_;
  }
  return &pPStack_30->super_JavascriptString;
}

Assistant:

JavascriptString * DynamicObjectPropertyEnumerator::MoveAndGetNextWithCache(PropertyId& propertyId, PropertyAttributes* attributes)
    {
#if ENABLE_TTD
        AssertMsg(!this->scriptContext->GetThreadContext()->IsRuntimeInTTDMode(), "We should always trap out to explicit enumeration in this case");
#endif

        Assert(enumeratedCount <= cachedData->cachedCount);
        JavascriptString* propertyStringName;
        PropertyAttributes propertyAttributes = PropertyNone;
        if (enumeratedCount < cachedData->cachedCount)
        {
            PropertyString * propertyString = cachedData->strings[enumeratedCount];
            propertyStringName = propertyString;
            propertyId = propertyString->GetPropertyId();

#if DBG
            PropertyId tempPropertyId;
            /* JavascriptString * tempPropertyString = */ this->MoveAndGetNextNoCache(tempPropertyId, attributes);

            Assert(tempPropertyId == propertyId);
            Assert(this->objectIndex == cachedData->indexes[enumeratedCount]);
#endif

            this->objectIndex = cachedData->indexes[enumeratedCount];
            propertyAttributes = cachedData->attributes[enumeratedCount];

            enumeratedCount++;
        }
        else if (!cachedData->completed)
        {
            propertyStringName = this->MoveAndGetNextNoCache(propertyId, &propertyAttributes);

            if (propertyStringName)
            {
                PropertyString* propertyString = JavascriptOperators::TryFromVar<PropertyString>(propertyStringName);
                if (propertyString != nullptr)
                {
                    Assert(enumeratedCount < this->initialPropertyCount);
                    cachedData->strings[enumeratedCount] = propertyString;
                    cachedData->indexes[enumeratedCount] = this->objectIndex;
                    cachedData->attributes[enumeratedCount] = propertyAttributes;
                    cachedData->cachedCount = ++enumeratedCount;
                }
            }
            else
            {
                cachedData->completed = true;
            }
        }
        else
        {
#if DBG
            PropertyId tempPropertyId;
            Assert(this->MoveAndGetNextNoCache(tempPropertyId, attributes) == nullptr);
#endif

            propertyStringName = nullptr;
        }

        if (attributes != nullptr)
        {
            *attributes = propertyAttributes;
        }

        return propertyStringName;
    }